

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O1

Node * __thiscall anon_unknown.dwarf_42055d::Db::parse(Db *this)

{
  _func_int **pp_Var1;
  _func_int **pp_Var2;
  char *pcVar3;
  bool bVar4;
  Node *pNVar5;
  Node *pNVar6;
  SpecialName *pSVar7;
  StringView S;
  StringView S_00;
  StringView SVar8;
  Node *Encoding;
  Node *local_30;
  
  SVar8.Last = "";
  SVar8.First = "_Z";
  bVar4 = consumeIf(this,SVar8);
  if (bVar4) {
    pNVar5 = parseEncoding(this);
    if (pNVar5 != (Node *)0x0) {
      pp_Var1 = (_func_int **)this->First;
      pp_Var2 = (_func_int **)this->Last;
      pNVar6 = pNVar5;
      if ((pp_Var2 != pp_Var1) && (*(char *)pp_Var1 == '.')) {
        pNVar6 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x28);
        pNVar6->K = KDotSuffix;
        pNVar6->RHSComponentCache = No;
        pNVar6->ArrayCache = No;
        pNVar6->FunctionCache = No;
        pNVar6->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_001eb838;
        pNVar6[1]._vptr_Node = (_func_int **)pNVar5;
        *(_func_int ***)&pNVar6[1].K = pp_Var1;
        pNVar6[2]._vptr_Node = pp_Var2;
        this->First = this->Last;
      }
      if (this->Last != this->First) {
        return (Node *)0x0;
      }
      return pNVar6;
    }
  }
  else {
    S.Last = "";
    S.First = "___Z";
    bVar4 = consumeIf(this,S);
    if (!bVar4) {
      pNVar5 = parseType(this);
      if (this->Last != this->First) {
        return (Node *)0x0;
      }
      return pNVar5;
    }
    local_30 = parseEncoding(this);
    if ((local_30 != (Node *)0x0) &&
       (S_00.Last = "", S_00.First = "_block_invoke", bVar4 = consumeIf(this,S_00), bVar4)) {
      pcVar3 = this->First;
      if ((pcVar3 == this->Last) || (*pcVar3 != '_')) {
        bVar4 = false;
      }
      else {
        this->First = pcVar3 + 1;
        bVar4 = true;
      }
      SVar8 = parseNumber(this,false);
      if ((bVar4) && (SVar8.First == SVar8.Last)) {
        return (Node *)0x0;
      }
      if (this->Last == this->First) {
        pSVar7 = (anonymous_namespace)::Db::
                 make<(anonymous_namespace)::SpecialName,char_const(&)[34],(anonymous_namespace)::Node*&>
                           ((Db *)this,(char (*) [34])"invocation function for block in ",&local_30)
        ;
        return &pSVar7->super_Node;
      }
    }
  }
  return (Node *)0x0;
}

Assistant:

Node *Db::parse() {
  if (consumeIf("_Z")) {
    Node *Encoding = parseEncoding();
    if (Encoding == nullptr)
      return nullptr;
    if (look() == '.') {
      Encoding = make<DotSuffix>(Encoding, StringView(First, Last));
      First = Last;
    }
    if (numLeft() != 0)
      return nullptr;
    return Encoding;
  }

  if (consumeIf("___Z")) {
    Node *Encoding = parseEncoding();
    if (Encoding == nullptr || !consumeIf("_block_invoke"))
      return nullptr;
    bool RequireNumber = consumeIf('_');
    if (parseNumber().empty() && RequireNumber)
      return nullptr;
    if (numLeft() != 0)
      return nullptr;
    return make<SpecialName>("invocation function for block in ", Encoding);
  }

  Node *Ty = parseType();
  if (numLeft() != 0)
    return nullptr;
  return Ty;
}